

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::DockSpaceOverViewport
                  (ImGuiViewport *viewport,ImGuiDockNodeFlags dockspace_flags,
                  ImGuiWindowClass *window_class)

{
  ImGuiID IVar1;
  ImVec2 *pos;
  ImGuiViewport *in_RDI;
  ImGuiID dockspace_id;
  char label [32];
  ImGuiWindowFlags host_window_flags;
  ImGuiWindowClass *in_stack_000000e8;
  ImGuiDockNodeFlags in_stack_000000f4;
  ImVec2 *in_stack_000000f8;
  ImGuiID in_stack_00000104;
  ImGuiWindowFlags in_stack_000003d4;
  bool *in_stack_000003d8;
  char *in_stack_000003e0;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImGuiStyleVar in_stack_ffffffffffffffc4;
  ImVec2 local_20 [3];
  ImGuiViewport *local_8;
  
  local_8 = in_RDI;
  if (in_RDI == (ImGuiViewport *)0x0) {
    local_8 = GetMainViewport();
  }
  pos = &local_8->Pos;
  ImVec2::ImVec2(local_20,0.0,0.0);
  SetNextWindowPos(pos,0,local_20);
  SetNextWindowSize(&local_8->Size,0);
  SetNextWindowViewport(local_8->ID);
  ImFormatString(&stack0xffffffffffffffb8,0x20,"DockSpaceViewport_%08X",(ulong)local_8->ID);
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,0.0,0.0);
  PushStyleVar(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  Begin(in_stack_000003e0,in_stack_000003d8,in_stack_000003d4);
  PopStyleVar((int)in_stack_ffffffffffffffa4);
  IVar1 = GetID((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,0.0,0.0);
  DockSpace(in_stack_00000104,in_stack_000000f8,in_stack_000000f4,in_stack_000000e8);
  End();
  return IVar1;
}

Assistant:

ImGuiID ImGui::DockSpaceOverViewport(ImGuiViewport* viewport, ImGuiDockNodeFlags dockspace_flags, const ImGuiWindowClass* window_class)
{
    if (viewport == NULL)
        viewport = GetMainViewport();

    SetNextWindowPos(viewport->Pos);
    SetNextWindowSize(viewport->Size);
    SetNextWindowViewport(viewport->ID);

    ImGuiWindowFlags host_window_flags = 0;
    host_window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoDocking;
    host_window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus | ImGuiWindowFlags_NoNavFocus;
    if (dockspace_flags & ImGuiDockNodeFlags_PassthruCentralNode)
        host_window_flags |= ImGuiWindowFlags_NoBackground;

    char label[32];
    ImFormatString(label, IM_ARRAYSIZE(label), "DockSpaceViewport_%08X", viewport->ID);

    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0.0f, 0.0f));
    Begin(label, NULL, host_window_flags);
    PopStyleVar(3);

    ImGuiID dockspace_id = GetID("DockSpace");
    DockSpace(dockspace_id, ImVec2(0.0f, 0.0f), dockspace_flags, window_class);
    End();

    return dockspace_id;
}